

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *constNode)

{
  Reader local_80;
  Reader local_50;
  bool local_1d;
  uint local_1c;
  bool dummy2;
  Reader *pRStack_18;
  uint dummy1;
  Reader *constNode_local;
  Validator *this_local;
  
  pRStack_18 = constNode;
  constNode_local = (Reader *)this;
  capnp::schema::Node::Const::Reader::getType(&local_50,constNode);
  capnp::schema::Node::Const::Reader::getValue(&local_80,pRStack_18);
  validate(this,&local_50,&local_80,&local_1c,&local_1d);
  return;
}

Assistant:

void validate(const schema::Node::Const::Reader& constNode) {
    uint dummy1;
    bool dummy2;
    validate(constNode.getType(), constNode.getValue(), &dummy1, &dummy2);
  }